

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int yaml_emitter_append_tag_directive
              (yaml_emitter_t *emitter,yaml_tag_directive_t value,int allow_duplicates)

{
  yaml_tag_directive_t **top;
  yaml_tag_directive_t *pyVar1;
  int iVar2;
  yaml_char_t *ptr;
  yaml_char_t *ptr_00;
  yaml_tag_directive_t *pyVar3;
  
  pyVar1 = (emitter->tag_directives).top;
  for (pyVar3 = (emitter->tag_directives).start; pyVar3 != pyVar1; pyVar3 = pyVar3 + 1) {
    iVar2 = strcmp((char *)value.handle,(char *)pyVar3->handle);
    if (iVar2 == 0) {
      if (allow_duplicates != 0) {
        return 1;
      }
      emitter->error = YAML_EMITTER_ERROR;
      emitter->problem = "duplicate %TAG directive";
      goto LAB_0010710c;
    }
  }
  ptr = yaml_strdup(value.handle);
  ptr_00 = yaml_strdup(value.prefix);
  if (ptr_00 == (yaml_char_t *)0x0 || ptr == (yaml_char_t *)0x0) {
LAB_001070da:
    emitter->error = YAML_MEMORY_ERROR;
    yaml_free(ptr);
    yaml_free(ptr_00);
LAB_0010710c:
    iVar2 = 0;
  }
  else {
    top = &(emitter->tag_directives).top;
    pyVar3 = (emitter->tag_directives).top;
    if (pyVar3 == (emitter->tag_directives).end) {
      iVar2 = yaml_stack_extend(&(emitter->tag_directives).start,top,&(emitter->tag_directives).end)
      ;
      if (iVar2 == 0) goto LAB_001070da;
      pyVar3 = *top;
    }
    *top = pyVar3 + 1;
    pyVar3->handle = ptr;
    pyVar3->prefix = ptr_00;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
yaml_emitter_append_tag_directive(yaml_emitter_t *emitter,
        yaml_tag_directive_t value, int allow_duplicates)
{
    yaml_tag_directive_t *tag_directive;
    yaml_tag_directive_t copy = { NULL, NULL };

    for (tag_directive = emitter->tag_directives.start;
            tag_directive != emitter->tag_directives.top; tag_directive ++) {
        if (strcmp((char *)value.handle, (char *)tag_directive->handle) == 0) {
            if (allow_duplicates)
                return 1;
            return yaml_emitter_set_emitter_error(emitter,
                    "duplicate %TAG directive");
        }
    }

    copy.handle = yaml_strdup(value.handle);
    copy.prefix = yaml_strdup(value.prefix);
    if (!copy.handle || !copy.prefix) {
        emitter->error = YAML_MEMORY_ERROR;
        goto error;
    }

    if (!PUSH(emitter, emitter->tag_directives, copy))
        goto error;

    return 1;

error:
    yaml_free(copy.handle);
    yaml_free(copy.prefix);
    return 0;
}